

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O3

void test_errors_in_accept(void)

{
  cio_alloc_client_t p_Var1;
  _func_cio_error_cio_timer_ptr_uint64_t_cio_timer_handler_t_void_ptr *p_Var2;
  cio_error cVar3;
  cio_inet_address *arg1;
  long lVar4;
  cio_http_server_configuration config;
  cio_http_server server;
  _func_cio_error_cio_timer_ptr_cio_eventloop_ptr_cio_timer_close_hook_t *local_248;
  undefined8 uStack_240;
  cio_http_server_configuration local_238;
  cio_http_server local_180;
  
  lVar4 = 0x28;
  do {
    p_Var1 = *(cio_alloc_client_t *)(&UNK_00118758 + lVar4);
    p_Var2 = *(_func_cio_error_cio_timer_ptr_uint64_t_cio_timer_handler_t_void_ptr **)
              ((long)&PTR_free_dummy_client_00118770 + lVar4);
    cVar3 = *(cio_error *)(&UNK_00118778 + lVar4);
    cio_server_socket_accept_fake.custom_fake =
         *(_func_cio_error_cio_server_socket_ptr_cio_accept_handler_t_void_ptr **)
          ((long)&test_errors_in_accept::accept_tests[0].alloc_client + lVar4);
    free(&client_socket[-2].impl.close_timer.impl.ev.fd);
    client_socket = (*p_Var1)();
    local_248 = *(_func_cio_error_cio_timer_ptr_cio_eventloop_ptr_cio_timer_close_hook_t **)
                 (&UNK_00118760 + lVar4);
    uStack_240 = *(undefined8 *)((long)&PTR_alloc_dummy_client_no_buffer_00118768 + lVar4);
    cio_timer_init_fake.custom_fake =
         (_func_cio_error_cio_timer_ptr_cio_eventloop_ptr_cio_timer_close_hook_t *)0x0;
    cio_timer_init_fake.custom_fake_seq_len = 2;
    local_238.endpoint.impl.sa._92_8_ = 0;
    local_238.endpoint.impl.sa._100_8_ = 0;
    local_238.endpoint.impl.sa._76_8_ = 0;
    local_238.endpoint.impl.sa._84_8_ = 0;
    local_238.endpoint.impl.sa._60_8_ = 0;
    local_238.endpoint.impl.sa._68_8_ = 0;
    local_238.endpoint.impl.sa._44_8_ = 0;
    local_238.endpoint.impl.sa._52_8_ = 0;
    local_238.endpoint.impl.sa._28_8_ = 0;
    local_238.endpoint.impl.sa._36_8_ = 0;
    local_238.endpoint.impl.sa._12_8_ = 0;
    local_238.endpoint.impl.sa._20_8_ = 0;
    local_238.endpoint.impl._0_8_ = 0;
    local_238.endpoint.impl.sa._4_8_ = 0;
    local_238.endpoint.impl.sa._108_4_ = 0;
    local_238.on_error = serve_error;
    local_238.read_header_timeout_ns = 5000000000;
    local_238.read_body_timeout_ns = 5000000000;
    local_238.response_timeout_ns = 5000000000;
    local_238.close_timeout_ns = 10;
    local_238.use_tcp_fastopen = false;
    local_238.free_client = free_dummy_client;
    cio_timer_init_fake.custom_fake_seq = &local_248;
    cio_timer_expires_from_now_fake.custom_fake = p_Var2;
    cio_buffered_stream_init_fake.return_val = cVar3;
    local_238.alloc_client = p_Var1;
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address(&local_238.endpoint,arg1,0x1f90);
    cVar3 = cio_http_server_init(&local_180,&loop,&local_238);
    UnityAssertEqualNumber
              (0,(long)cVar3,"Server initialization failed!",0x6b7,UNITY_DISPLAY_STYLE_INT);
    split_request("GET /foo HTTP/1.1\r\n\r\n");
    cVar3 = cio_http_server_serve(&local_180);
    UnityAssertEqualNumber(0,(long)cVar3,"Serving http failed!",0x6bb,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)serve_error_fake.call_count,"Serve error callback was not called!",0x6bc,
               UNITY_DISPLAY_STYLE_INT);
    if (p_Var1 != alloc_dummy_client_no_iostream) {
      UnityAssertEqualNumber
                (1,(ulong)stream_close_fake.call_count,"stream was not closed!",0x6bf,
                 UNITY_DISPLAY_STYLE_INT);
    }
    setUp();
    lVar4 = lVar4 + 0x38;
  } while (lVar4 != 0x1e8);
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_errors_in_accept(void)
{
	struct accept_test {
		struct cio_socket *(*alloc_client)(void);
		enum cio_error (*response_timer_init)(struct cio_timer *timer, struct cio_eventloop *l, cio_timer_close_hook_t hook);
		enum cio_error (*request_timer_init)(struct cio_timer *timer, struct cio_eventloop *l, cio_timer_close_hook_t hook);
		enum cio_error (*timer_expires)(struct cio_timer *t, uint64_t timeout_ns, cio_timer_handler_t handler, void *handler_context);
		enum cio_error buffered_stream_init_return_val;
		enum cio_error (*accept_handler)(struct cio_server_socket *ss, cio_accept_handler_t handler, void *handler_context);

		const char *request;
	};

	static const struct accept_test accept_tests[] = {
	    {.accept_handler = accept_error_handler,
	     .alloc_client = alloc_dummy_client,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_NO_MEMORY,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client_no_buffer,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client_no_iostream,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_error_handler,
	     .alloc_client = alloc_dummy_client_no_iostream,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client,
	     .response_timer_init = cio_timer_init_fails,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_fails,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires_error,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(accept_tests); i++) {
		struct accept_test accept_test = accept_tests[i];
		cio_server_socket_accept_fake.custom_fake = accept_test.accept_handler;

		free_dummy_client(client_socket);
		client_socket = accept_test.alloc_client();

		enum cio_error (*timer_init_fakes[])(struct cio_timer *timer, struct cio_eventloop *l, cio_timer_close_hook_t hook) = {
		    accept_test.response_timer_init,
		    accept_test.request_timer_init};

		cio_timer_init_fake.custom_fake = NULL;
		SET_CUSTOM_FAKE_SEQ(cio_timer_init, timer_init_fakes, ARRAY_SIZE(timer_init_fakes))

		cio_timer_expires_from_now_fake.custom_fake = accept_test.timer_expires;
		cio_buffered_stream_init_fake.return_val = accept_test.buffered_stream_init_return_val;

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = accept_test.alloc_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

		split_request(accept_test.request);
		err = cio_http_server_serve(&server);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");
		TEST_ASSERT_EQUAL_MESSAGE(1, serve_error_fake.call_count, "Serve error callback was not called!");

		if (accept_test.alloc_client != alloc_dummy_client_no_iostream) {
			TEST_ASSERT_EQUAL_MESSAGE(1, stream_close_fake.call_count, "stream was not closed!");
		}

		setUp();
	}

	free_dummy_client(client_socket);
}